

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O0

int scroll_indicator_size_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  float local_40;
  float percent;
  int maxsize;
  int size;
  Am_Widget_Look look;
  Am_Object local_20;
  Am_Object scroll_bar;
  Am_Object *self_local;
  
  scroll_bar.data = (Am_Object_Data *)self;
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)self);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    pAVar3 = Am_Object::Get(&local_20,0x17f,0);
    Am_Widget_Look::Am_Widget_Look((Am_Widget_Look *)&maxsize,pAVar3);
    bVar1 = Am_Widget_Look::operator==((Am_Widget_Look *)&maxsize,&Am_MACINTOSH_LOOK);
    if (bVar1) {
      percent = 2.24208e-44;
    }
    else {
      pAVar3 = Am_Object::Get(&local_20,0x1b4,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar3);
      pAVar3 = Am_Object::Get(&local_20,0x185,0);
      local_40 = Am_Value::operator_cast_to_float(pAVar3);
      if (1.0 < local_40) {
        local_40 = 1.0;
      }
      percent = (float)(int)((float)iVar2 * local_40);
      if ((int)percent < 6) {
        percent = 8.40779e-45;
      }
    }
    self_local._4_4_ = percent;
  }
  else {
    self_local._4_4_ = 1.4013e-44;
  }
  size = 1;
  Am_Object::~Am_Object(&local_20);
  return (int)self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, scroll_indicator_size)
{
  Am_Object scroll_bar = self.Get_Owner();
  if (!scroll_bar.Valid())
    return 10;
  Am_Widget_Look look = scroll_bar.Get(Am_WIDGET_LOOK);

  int size = 0;
  if (look == Am_MACINTOSH_LOOK)
    size = 16;
  else {
    int maxsize = scroll_bar.Get(Am_SCROLL_AREA_SIZE);
    float percent = scroll_bar.Get(Am_PERCENT_VISIBLE);
    if (percent > 1.0f)
      percent = 1.0f;
    size = (int)(maxsize * percent);
    if (size < 6)
      size = 6;
  }
  return size;
}